

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_remove_checked(roaring_bitmap_t *r,uint32_t val)

{
  container_t *c;
  undefined4 in_EAX;
  uint i;
  int iVar1;
  container_t *c_00;
  uint8_t uVar2;
  _Bool _Var3;
  uint8_t newtypecode;
  undefined4 uStack_38;
  int local_34;
  
  uStack_38 = in_EAX;
  i = ra_get_index(&r->high_low_container,(uint16_t)(val >> 0x10));
  if ((int)i < 0) {
    _Var3 = false;
  }
  else {
    ra_unshare_container_at_index(&r->high_low_container,(uint16_t)i);
    uVar2 = (r->high_low_container).typecodes[i & 0xffff];
    c = (r->high_low_container).containers[i & 0xffff];
    iVar1 = container_get_cardinality(c,uVar2);
    uStack_38 = CONCAT13(uVar2,(undefined3)uStack_38);
    _uStack_38 = CONCAT44(iVar1,uStack_38);
    c_00 = container_remove(c,(uint16_t)val,uVar2,(uint8_t *)((long)&uStack_38 + 3));
    if (c_00 == c) {
      uVar2 = uStack_38._3_1_;
    }
    else {
      container_free(c,uVar2);
      (r->high_low_container).containers[i] = c_00;
      (r->high_low_container).typecodes[i] = uStack_38._3_1_;
      uVar2 = uStack_38._3_1_;
    }
    iVar1 = container_get_cardinality(c_00,uVar2);
    if (iVar1 == 0) {
      ra_remove_at_index_and_free(&r->high_low_container,i);
    }
    else {
      (r->high_low_container).containers[i] = c_00;
      (r->high_low_container).typecodes[i] = uVar2;
    }
    _Var3 = local_34 != iVar1;
  }
  return _Var3;
}

Assistant:

bool roaring_bitmap_remove_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }

        const int newCardinality =
            container_get_cardinality(container2, newtypecode);

        if (newCardinality != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }

        result = oldCardinality != newCardinality;
    }
    return result;
}